

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

Vec2 __thiscall
tcu::computeVulkanLodBoundsFromDerivates
          (tcu *this,float dudx,float dvdx,float dwdx,float dudy,float dvdy,float dwdy,
          LodPrecision *prec)

{
  Vec2 VVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float extraout_XMM0_Db;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar2 = -(uint)(-dudx <= dudx);
  uVar3 = -(uint)(-dvdx <= dvdx);
  fVar8 = (float)(~uVar2 & (uint)-dudx | (uint)dudx & uVar2);
  fVar9 = (float)(~uVar3 & (uint)-dvdx | (uint)dvdx & uVar3);
  uVar2 = -(uint)(-dwdx <= dwdx);
  uVar4 = -(uint)(-dwdy <= dwdy);
  uVar3 = -(uint)(-dudy <= dudy);
  uVar5 = -(uint)(-dvdy <= dvdy);
  fVar10 = (float)(~uVar3 & (uint)-dudy | (uint)dudy & uVar3);
  fVar12 = (float)(~uVar5 & (uint)-dvdy | (uint)dvdy & uVar5);
  fVar11 = (float)(~uVar2 & (uint)-dwdx | (uint)dwdx & uVar2);
  fVar13 = (float)(~uVar4 & (uint)-dwdy | (uint)dwdy & uVar4);
  fVar6 = (float)(~-(uint)(fVar9 <= fVar8) & (uint)fVar9 | (uint)fVar8 & -(uint)(fVar9 <= fVar8));
  fVar7 = (float)(~-(uint)(fVar12 <= fVar10) & (uint)fVar12 |
                 (uint)fVar10 & -(uint)(fVar12 <= fVar10));
  uVar2 = -(uint)(fVar11 <= fVar6);
  uVar3 = -(uint)(fVar13 <= fVar7);
  fVar6 = (float)(~uVar2 & (uint)fVar11 | (uint)fVar6 & uVar2);
  fVar7 = (float)(~uVar3 & (uint)fVar13 | (uint)fVar7 & uVar3);
  fVar11 = (fVar9 + fVar8 + fVar11) * 1.4142135;
  fVar13 = (fVar12 + fVar10 + fVar13) * 1.4142135;
  uVar2 = -(uint)(fVar7 <= fVar6);
  fVar6 = (float)(~uVar2 & (uint)fVar7 | (uint)fVar6 & uVar2);
  uVar2 = -(uint)(fVar13 <= fVar11);
  fVar7 = (float)(~uVar2 & (uint)fVar13 | (uint)fVar11 & uVar2);
  fVar11 = TexVerifierUtil::computeFloatingPointError(fVar6,prec->derivateBits);
  fVar13 = TexVerifierUtil::computeFloatingPointError(fVar7,prec->derivateBits);
  fVar11 = deFloatLog2(fVar6 - fVar11);
  fVar13 = deFloatLog2(fVar13 + fVar7);
  fVar6 = TexVerifierUtil::computeFixedPointError(prec->lodBits);
  *(float *)this = fVar11 - fVar6;
  *(float *)(this + 4) = fVar13 + fVar6;
  VVar1.m_data[1] = extraout_XMM0_Db;
  VVar1.m_data[0] = fVar6;
  return (Vec2)VVar1.m_data;
}

Assistant:

Vec2 computeVulkanLodBoundsFromDerivates (const float dudx, const float dvdx, const float dwdx, const float dudy, const float dvdy, const float dwdy, const LodPrecision& prec)
{
	const float		mux			= deFloatAbs(dudx);
	const float		mvx			= deFloatAbs(dvdx);
	const float		mwx			= deFloatAbs(dwdx);
	const float		muy			= deFloatAbs(dudy);
	const float		mvy			= deFloatAbs(dvdy);
	const float		mwy			= deFloatAbs(dwdy);

	// Ideal:
	// px = deFloatSqrt2(mux*mux + mvx*mvx + mwx*mwx);
	// py = deFloatSqrt2(muy*muy + mvy*mvy + mwy*mwy);

	// fx, fy estimate lower bounds
	const float		fxMin		= de::max(de::max(mux, mvx), mwx);
	const float		fyMin		= de::max(de::max(muy, mvy), mwy);

	// fx, fy estimate upper bounds
	const float		sqrt2		= deFloatSqrt(2.0f);
	const float		fxMax		= sqrt2 * (mux + mvx + mwx);
	const float		fyMax		= sqrt2 * (muy + mvy + mwy);

	// p = max(px, py) (isotropic filtering)
	const float		pMin		= de::max(fxMin, fyMin);
	const float		pMax		= de::max(fxMax, fyMax);

	// error terms
	const float		pMinErr		= computeFloatingPointError(pMin, prec.derivateBits);
	const float		pMaxErr		= computeFloatingPointError(pMax, prec.derivateBits);

	const float		minLod		= deFloatLog2(pMin-pMinErr);
	const float		maxLod		= deFloatLog2(pMax+pMaxErr);
	const float		lodErr		= computeFixedPointError(prec.lodBits);

	DE_ASSERT(minLod <= maxLod);
	return Vec2(minLod-lodErr, maxLod+lodErr);
}